

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float64 float64_scalbn_aarch64(float64 a,int n,float_status *status)

{
  float64 fVar1;
  FloatParts FVar2;
  FloatParts pr;
  FloatParts pa;
  float_status *status_local;
  int n_local;
  float64 a_local;
  
  FVar2 = float64_unpack_canonical(a,status);
  FVar2 = scalbn_decomposed(FVar2,n,status);
  fVar1 = float64_round_pack_canonical(FVar2,status);
  return fVar1;
}

Assistant:

float64 float64_scalbn(float64 a, int n, float_status *status)
{
    FloatParts pa = float64_unpack_canonical(a, status);
    FloatParts pr = scalbn_decomposed(pa, n, status);
    return float64_round_pack_canonical(pr, status);
}